

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BER.h
# Opt level: O2

void __thiscall OIDType::~OIDType(OIDType *this)

{
  ~OIDType(this);
  operator_delete(this);
  return;
}

Assistant:

explicit OIDType(const std::string& value): BER_CONTAINER(OID), _value(value) {
        // When creating a user OID, we generate our data vector immediately
        this->valid = this->generateInternalData();
    }